

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_SetWindowSize(ImGuiViewport *viewport,ImVec2 size)

{
  undefined8 *puVar1;
  int iVar2;
  float local_18;
  float fStack_14;
  
  puVar1 = (undefined8 *)viewport->PlatformUserData;
  iVar2 = ImGui::GetFrameCount();
  local_18 = size.x;
  fStack_14 = size.y;
  *(int *)((long)puVar1 + 0xc) = iVar2;
  glfwSetWindowSize((GLFWwindow *)*puVar1,(int)local_18,(int)fStack_14);
  return;
}

Assistant:

static void ImGui_ImplGlfw_SetWindowSize(ImGuiViewport* viewport, ImVec2 size)
{
    ImGuiViewportDataGlfw* data = (ImGuiViewportDataGlfw*)viewport->PlatformUserData;
#if __APPLE__
    // Native OS windows are positioned from the bottom-left corner on macOS, whereas on other platforms they are
    // positioned from the upper-left corner. GLFW makes an effort to convert macOS style coordinates, however it
    // doesn't handle it when changing size. We are manually moving the window in order for changes of size to be based
    // on the upper-left corner.
    int x, y, width, height;
    glfwGetWindowPos(data->Window, &x, &y);
    glfwGetWindowSize(data->Window, &width, &height);
    glfwSetWindowPos(data->Window, x, y - height + size.y);
#endif
    data->IgnoreWindowSizeEventFrame = ImGui::GetFrameCount();
    glfwSetWindowSize(data->Window, (int)size.x, (int)size.y);
}